

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_prec.c
# Opt level: O2

void PrintAllSpecies(N_Vector c,int ns,int mxns,sunrealtype t)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  lVar3 = N_VGetArrayPointer();
  printf("c values at t = %g:\n\n",t);
  iVar1 = 0;
  if (0 < ns) {
    iVar1 = ns;
  }
  iVar4 = mxns * 5;
  for (iVar6 = 1; iVar6 != iVar1 + 1; iVar6 = iVar6 + 1) {
    printf("Species %d\n");
    iVar2 = iVar4;
    for (iVar7 = 5; -1 < iVar7; iVar7 = iVar7 + -1) {
      lVar5 = 6;
      iVar8 = iVar2;
      while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
        printf("%-10.6g",*(undefined8 *)(lVar3 + (long)iVar8 * 8));
        iVar8 = iVar8 + ns;
      }
      putchar(10);
      iVar2 = iVar2 - mxns;
    }
    putchar(10);
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

static void PrintAllSpecies(N_Vector c, int ns, int mxns, sunrealtype t)
{
  int i, jx, jy;
  sunrealtype* cdata;

  cdata = N_VGetArrayPointer(c);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("c values at t = %Lg:\n\n", t);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("c values at t = %g:\n\n", t);
#else
  printf("c values at t = %g:\n\n", t);
#endif
  for (i = 1; i <= ns; i++)
  {
    printf("Species %d\n", i);
    for (jy = MY - 1; jy >= 0; jy--)
    {
      for (jx = 0; jx < MX; jx++)
      {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        printf("%-10.6Lg", cdata[(i - 1) + jx * ns + jy * mxns]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#else
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#endif
      }
      printf("\n");
    }
    printf("\n");
  }
}